

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

char * __thiscall
google::protobuf::Message::_InternalParse(Message *this,char *ptr,ParseContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Descriptor *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  char *pcVar5;
  Reflection *extraout_RDX;
  ReflectiveFieldParser field_parser;
  LogFinisher local_131;
  string local_130;
  string local_110;
  LogMessage local_f0;
  ReflectiveFieldParser local_b8;
  LogMessage local_68;
  
  paVar1 = &local_b8.payload_.field_2;
  local_b8.msg_ = this;
  iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0x15])();
  local_b8.descriptor_ = (Descriptor *)CONCAT44(extraout_var,iVar3);
  (*(this->super_MessageLite)._vptr_MessageLite[0x15])(this);
  pDVar2 = local_b8.descriptor_;
  local_b8.unknown_ = (UnknownFieldSet *)0x0;
  local_b8.is_item_ = false;
  local_b8.type_id_ = 0;
  local_b8.payload_._M_string_length = 0;
  local_b8.payload_.field_2._M_local_buf[0] = '\0';
  local_b8.reflection_ = extraout_RDX;
  local_b8.ctx_ = ctx;
  local_b8.payload_._M_dataplus._M_p = (pointer)paVar1;
  if (local_b8.descriptor_ == (Descriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x1e3);
    pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: descriptor_: ");
    (*(this->super_MessageLite)._vptr_MessageLite[2])(&local_110,this);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_110);
    internal::LogFinisher::operator=((LogFinisher *)&local_f0,pLVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if (pDVar2 == (Descriptor *)0x0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (local_b8.reflection_ == (Reflection *)0x0) {
    internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x1e4);
    pLVar4 = internal::LogMessage::operator<<(&local_f0,"CHECK failed: reflection_: ");
    (*(this->super_MessageLite)._vptr_MessageLite[2])(&local_130,this);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_130);
    internal::LogFinisher::operator=(&local_131,pLVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if (local_b8.reflection_ == (Reflection *)0x0) {
    internal::LogMessage::~LogMessage(&local_f0);
  }
  pcVar5 = internal::
           WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                     (&local_b8,ptr,ctx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.payload_._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.payload_._M_dataplus._M_p);
  }
  return pcVar5;
}

Assistant:

const char* Message::_InternalParse(const char* ptr,
                                    internal::ParseContext* ctx) {
  class ReflectiveFieldParser {
   public:
    ReflectiveFieldParser(Message* msg, internal::ParseContext* ctx)
        : ReflectiveFieldParser(msg, ctx, false) {}

    void AddVarint(uint32 num, uint64 value) {
      if (is_item_ && num == 2) {
        if (!payload_.empty()) {
          auto field = Field(value, 2);
          if (field && field->message_type()) {
            auto child = reflection_->MutableMessage(msg_, field);
            // TODO(gerbens) signal error
            child->ParsePartialFromString(payload_);
          } else {
            MutableUnknown()->AddLengthDelimited(value)->swap(payload_);
          }
          return;
        }
        type_id_ = value;
        return;
      }
      auto field = Field(num, 0);
      if (field) {
        SetField(value, field, msg_, reflection_);
      } else {
        MutableUnknown()->AddVarint(num, value);
      }
    }
    void AddFixed64(uint32 num, uint64 value) {
      auto field = Field(num, 1);
      if (field) {
        SetField(value, field, msg_, reflection_);
      } else {
        MutableUnknown()->AddFixed64(num, value);
      }
    }
    const char* ParseLengthDelimited(uint32 num, const char* ptr,
                                     internal::ParseContext* ctx) {
      if (is_item_ && num == 3) {
        if (type_id_ == 0) {
          return InlineGreedyStringParser(&payload_, ptr, ctx);
        }
        num = type_id_;
        type_id_ = 0;
      }
      auto field = Field(num, 2);
      if (field) {
        return ParseLenDelim(num, field, msg_, reflection_, ptr, ctx);
      } else {
        return InlineGreedyStringParser(
            MutableUnknown()->AddLengthDelimited(num), ptr, ctx);
      }
    }
    const char* ParseGroup(uint32 num, const char* ptr,
                           internal::ParseContext* ctx) {
      if (!is_item_ && descriptor_->options().message_set_wire_format() &&
          num == 1) {
        is_item_ = true;
        ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
        is_item_ = false;
        type_id_ = 0;
        return ptr;
      }
      auto field = Field(num, 3);
      if (field) {
        auto msg = GetGroup(num, field, msg_, reflection_);
        return ctx->ParseGroup(msg, ptr, num * 8 + 3);
      } else {
        return UnknownFieldParse(num * 8 + 3, MutableUnknown(), ptr, ctx);
      }
    }
    void AddFixed32(uint32 num, uint32 value) {
      auto field = Field(num, 5);
      if (field) {
        SetField(value, field, msg_, reflection_);
      } else {
        MutableUnknown()->AddFixed32(num, value);
      }
    }

    const char* _InternalParse(const char* ptr, internal::ParseContext* ctx) {
      // We're parsing the a MessageSetItem
      GOOGLE_DCHECK(is_item_);
      return internal::WireFormatParser(*this, ptr, ctx);
    }

   private:
    Message* msg_;
    const Descriptor* descriptor_;
    const Reflection* reflection_;
    internal::ParseContext* ctx_;
    UnknownFieldSet* unknown_ = nullptr;
    bool is_item_ = false;
    uint32 type_id_ = 0;
    std::string payload_;

    ReflectiveFieldParser(Message* msg, internal::ParseContext* ctx,
                          bool is_item)
        : msg_(msg),
          descriptor_(msg->GetDescriptor()),
          reflection_(msg->GetReflection()),
          ctx_(ctx),
          is_item_(is_item) {
      GOOGLE_CHECK(descriptor_) << msg->GetTypeName();
      GOOGLE_CHECK(reflection_) << msg->GetTypeName();
    }

    const FieldDescriptor* Field(int num, int wire_type) {
      auto field = descriptor_->FindFieldByNumber(num);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor_->IsExtensionNumber(num)) {
        const DescriptorPool* pool = ctx_->data().pool;
        if (pool == NULL) {
          field = reflection_->FindKnownExtensionByNumber(num);
        } else {
          field = pool->FindExtensionByNumber(descriptor_, num);
        }
      }
      if (field == nullptr) return nullptr;

      if (internal::WireFormat::WireTypeForFieldType(field->type()) !=
          wire_type) {
        if (field->is_packable()) {
          if (wire_type ==
              internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
            return field;
          }
        }
        return nullptr;
      }
      return field;
    }

    UnknownFieldSet* MutableUnknown() {
      if (unknown_) return unknown_;
      return unknown_ = reflection_->MutableUnknownFields(msg_);
    }
  };

  ReflectiveFieldParser field_parser(this, ctx);
  return internal::WireFormatParser(field_parser, ptr, ctx);
}